

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpContext.cpp
# Opt level: O3

int xmrig::HttpContext::onHeaderValue(http_parser *parser,char *at,size_t length)

{
  void *pvVar1;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  pvVar1 = parser->data;
  if (*(char *)((long)pvVar1 + 0x90) == '\0') {
    local_40[0] = local_30;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_40,at,at + length);
    std::__cxx11::string::operator=((string *)((long)pvVar1 + 200),(string *)local_40);
    if (local_40[0] != local_30) {
      operator_delete(local_40[0]);
    }
    *(undefined1 *)((long)pvVar1 + 0x90) = 1;
  }
  else {
    local_40[0] = local_30;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_40,at,at + length);
    std::__cxx11::string::_M_append((char *)((long)pvVar1 + 200),(ulong)local_40[0]);
    if (local_40[0] != local_30) {
      operator_delete(local_40[0]);
    }
  }
  return 0;
}

Assistant:

int xmrig::HttpContext::onHeaderValue(http_parser *parser, const char *at, size_t length)
{
    auto ctx = static_cast<HttpContext*>(parser->data);

    if (!ctx->m_wasHeaderValue) {
        ctx->m_lastHeaderValue = std::string(at, length);
        ctx->m_wasHeaderValue  = true;
    } else {
        ctx->m_lastHeaderValue += std::string(at, length);
    }

    return 0;
}